

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall
Js::GlobalObject::StrictEquals
          (GlobalObject *this,Var other,BOOL *value,ScriptContext *requestContext)

{
  RecyclableObject **ppRVar1;
  RecyclableObject *pRVar2;
  HostObjectBase **ppHVar3;
  HostObjectBase *pHVar4;
  ScriptContext *requestContext_local;
  BOOL *value_local;
  Var other_local;
  GlobalObject *this_local;
  
  if (this == (GlobalObject *)other) {
    *value = 1;
    this_local._4_4_ = 1;
  }
  else {
    ppRVar1 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->directHostObject);
    if (*ppRVar1 == (RecyclableObject *)0x0) {
      ppHVar3 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                          ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
      if (*ppHVar3 == (HostObjectBase *)0x0) {
        *value = 0;
        this_local._4_4_ = 0;
      }
      else {
        pHVar4 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                           (&(this->super_RootObjectBase).hostObject);
        this_local._4_4_ = (**(code **)(*(long *)pHVar4 + 0x178))(pHVar4,other,value,requestContext)
        ;
      }
    }
    else {
      pRVar2 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
      this_local._4_4_ =
           (*(pRVar2->super_FinalizableObject).super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[0x2f])(pRVar2,other,value,requestContext);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL GlobalObject::StrictEquals(__in Js::Var other, __out BOOL* value, ScriptContext * requestContext)
    {
        if (this == other)
        {
            *value = TRUE;
            return TRUE;
        }
        else if (this->directHostObject)
        {
            return this->directHostObject->StrictEquals(other, value, requestContext);
        }
        else if (this->hostObject)
        {
            return this->hostObject->StrictEquals(other, value, requestContext);
        }
        *value = FALSE;
        return FALSE;
    }